

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::(anonymous_namespace)::TestCase2447::run()::__1>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_32_4_3c2e597a *func)

{
  anon_class_32_4_3c2e597a *func_local;
  
  anon_unknown_0::TestCase2447::run::anon_class_32_4_3c2e597a::operator()
            ((anon_class_32_4_3c2e597a *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}